

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O1

void __thiscall
juzzlin::Argengine::addOption
          (Argengine *this,OptionSet *optionVariants,ValuelessCallback *callback,bool required,
          string *infoText)

{
  _Head_base<0UL,_juzzlin::Argengine::Impl_*,_false> optionVariants_00;
  undefined7 in_register_00000009;
  _Any_data _Stack_58;
  code *local_48;
  pointer local_30;
  
  optionVariants_00._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<juzzlin::Argengine::Impl,_std::default_delete<juzzlin::Argengine::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_juzzlin::Argengine::Impl_*,_std::default_delete<juzzlin::Argengine::Impl>_>
       .super__Head_base<0UL,_juzzlin::Argengine::Impl_*,_false>._M_head_impl;
  std::function<void_()>::function((function<void_()> *)&_Stack_58,callback);
  Impl::addOption((Impl *)&stack0xffffffffffffffc8,(OptionSet *)optionVariants_00._M_head_impl,
                  (ValuelessCallback *)optionVariants,SUB81(&_Stack_58,0),
                  (string *)(CONCAT71(in_register_00000009,required) & 0xffffffff));
  if (local_30 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&_Stack_58,&_Stack_58,__destroy_functor);
  }
  return;
}

Assistant:

void Argengine::addOption(OptionSet optionVariants, ValuelessCallback callback, bool required, std::string infoText)
{
    m_impl->addOption(optionVariants, callback, required, infoText);
}